

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# direct_lower_upper_factorisation.hpp
# Opt level: O2

bool __thiscall
Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_true>::factorise
          (Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_true> *this,
          Matrix_Dense<double,_0UL,_0UL> *a_matrix)

{
  Matrix_Dense<double,_0UL,_0UL> *this_00;
  pointer puVar1;
  pointer puVar2;
  bool bVar3;
  size_t sVar4;
  ulong uVar5;
  pointer pVVar6;
  long lVar7;
  size_t i_row_sweep;
  ulong uVar8;
  unsigned_long uVar9;
  pointer pVVar10;
  ulong uVar11;
  size_t i_column_sweep;
  ulong uVar12;
  Scalar absA;
  Scalar max;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_40;
  long local_38;
  
  this->factorised = false;
  this_00 = &this->lu_factorised;
  std::vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>::
  operator=(&this_00->
             super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ,&a_matrix->
              super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
           );
  sVar4 = Matrix_Dense<double,_0UL,_0UL>::size_column(this_00);
  local_40 = &this->pivots;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&this->pivots,sVar4);
  puVar1 = (this->pivots).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->pivots).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar9 = 0;
  for (lVar7 = 0; (pointer)((long)puVar1 + lVar7) != puVar2; lVar7 = lVar7 + 8) {
    puVar1[uVar9] = uVar9;
    uVar9 = uVar9 + 1;
  }
  pVVar10 = (this->lu_factorised).
            super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            .
            super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pVVar6 = (this->lu_factorised).
           super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
           .
           super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar7 = 0;
  uVar11 = 0;
  while( true ) {
    uVar5 = ((long)pVVar6 - (long)pVVar10) / 0x18;
    if (uVar5 <= uVar11) break;
    max = 0.0;
    uVar8 = uVar11;
    uVar12 = uVar11;
    local_38 = lVar7;
    while( true ) {
      sVar4 = Matrix_Dense<double,_0UL,_0UL>::size_column(this_00);
      if (sVar4 <= uVar8) break;
      absA = ABS(*(Scalar *)
                  (*(long *)((long)&(((this_00->
                                      super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                                      ).
                                      super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super_vector<double,_std::allocator<double>_>).
                                    super__Vector_base<double,_std::allocator<double>_> + lVar7) +
                  uVar11 * 8));
      bVar3 = is_nearly_greater(&absA,&max,(Scalar *)&default_relative,(Scalar *)&default_absolute);
      if (bVar3) {
        max = absA;
        uVar12 = uVar8;
      }
      uVar8 = uVar8 + 1;
      lVar7 = lVar7 + 0x18;
    }
    if (uVar12 != uVar11) {
      puVar1 = (local_40->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
               .super__Vector_impl_data._M_start;
      uVar9 = puVar1[uVar11];
      puVar1[uVar11] = puVar1[uVar12];
      puVar1[uVar12] = uVar9;
      pVVar10 = (this_00->
                super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                ).
                super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      std::swap<Disa::Vector_Dense<double,0ul>>(pVVar10 + uVar11,pVVar10 + uVar12);
    }
    pVVar10 = (this->lu_factorised).
              super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
              .
              super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (ABS(*(double *)
             (*(long *)&pVVar10[uVar11].super_vector<double,_std::allocator<double>_>.
                        super__Vector_base<double,_std::allocator<double>_> + uVar11 * 8)) <
        this->factorisation_tolerance) goto LAB_0010c2e5;
    uVar5 = uVar11 + 1;
    uVar8 = uVar5;
    while( true ) {
      pVVar6 = (this->lu_factorised).
               super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
               .
               super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((ulong)(((long)pVVar6 - (long)pVVar10) / 0x18) <= uVar8) break;
      lVar7 = *(long *)&pVVar10[uVar8].super_vector<double,_std::allocator<double>_>.
                        super__Vector_base<double,_std::allocator<double>_>;
      *(double *)(lVar7 + uVar11 * 8) =
           *(double *)(lVar7 + uVar11 * 8) /
           *(double *)
            (*(long *)&pVVar10[uVar11].super_vector<double,_std::allocator<double>_>.
                       super__Vector_base<double,_std::allocator<double>_> + uVar11 * 8);
      uVar12 = uVar5;
      while( true ) {
        sVar4 = Matrix_Dense<double,_0UL,_0UL>::size_column(this_00);
        if (sVar4 <= uVar12) break;
        pVVar10 = (this_00->
                  super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                  ).
                  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar7 = *(long *)&pVVar10[uVar8].super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>;
        *(double *)(lVar7 + uVar12 * 8) =
             *(double *)(lVar7 + uVar12 * 8) -
             *(double *)(lVar7 + uVar11 * 8) *
             *(double *)
              (*(long *)&pVVar10[uVar11].super_vector<double,_std::allocator<double>_>.
                         super__Vector_base<double,_std::allocator<double>_> + uVar12 * 8);
        uVar12 = uVar12 + 1;
      }
      uVar8 = uVar8 + 1;
      pVVar10 = (this_00->
                super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                ).
                super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    lVar7 = local_38 + 0x18;
    uVar11 = uVar5;
  }
  this->factorised = true;
LAB_0010c2e5:
  return uVar5 <= uVar11;
}

Assistant:

bool Direct_Lower_Upper_Factorisation<_solver_type, _size, _pivot>::factorise(
const Matrix_Dense<Scalar, _size, _size>& a_matrix) {

  // Initialise factorisation data.
  factorised = false;
  lu_factorised = a_matrix;
  if(_pivot) {
    pivots.resize(lu_factorised.size_column());
    std::iota(pivots.begin(), pivots.end(), 0);
  }

  // Factorise A into L and U.
  for(std::size_t i_row = 0; i_row < lu_factorised.size_row(); ++i_row) {

    // Pivoting
    if(_pivot) {

      // Find largest remaining column value to pivot on.
      Scalar max = 0.0;
      std::size_t i_max = i_row;
      for(std::size_t i_row_sweep = i_row; i_row_sweep < lu_factorised.size_column(); ++i_row_sweep) {
        const Scalar absA = std::abs(lu_factorised[i_row_sweep][i_row]);
        if(is_nearly_greater(absA, max)) {
          max = absA;
          i_max = i_row_sweep;
        }
      }

      // Pivot if larger value found.
      if(i_max != i_row) {
        std::swap(pivots[i_row], pivots[i_max]);
        std::swap(lu_factorised[i_row], lu_factorised[i_max]);
      }
    }

    // Check degeneracy.
    if(std::abs(lu_factorised[i_row][i_row]) < factorisation_tolerance) return false;

    // Decomposition, actual factorisation to compute L and U.
    for(std::size_t i_row_sweep = i_row + 1; i_row_sweep < lu_factorised.size_row(); ++i_row_sweep) {
      lu_factorised[i_row_sweep][i_row] /= lu_factorised[i_row][i_row];

      for(std::size_t i_column_sweep = i_row + 1; i_column_sweep < lu_factorised.size_column(); ++i_column_sweep)
        lu_factorised[i_row_sweep][i_column_sweep] -=
        lu_factorised[i_row_sweep][i_row] * lu_factorised[i_row][i_column_sweep];
    }
  }

  factorised = true;
  return true;
}